

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vicv.cpp
# Opt level: O2

void __thiscall E64::vicv_ic::vicv_ic(vicv_ic *this)

{
  uint8_t *puVar1;
  
  this->stats_visible = false;
  this->disk_stat_visible = true;
  puVar1 = (machine.mmu)->ram;
  this->fb0 = (uint16_t *)(puVar1 + 0xf00000);
  this->fb1 = (uint16_t *)(puVar1 + 0xf48000);
  this->breakpoint_reached = false;
  clear_scanline_breakpoints(this);
  this->old_y_pos = 0;
  this->stats_text = (char *)0x0;
  return;
}

Assistant:

E64::vicv_ic::vicv_ic()
{
	disk_stat_visible = true;
	stats_visible = false;

	fb0 = (uint16_t *)&machine.mmu->ram[VICV_FB0];
	fb1 = (uint16_t *)&machine.mmu->ram[VICV_FB1];

	breakpoint_reached = false;
	clear_scanline_breakpoints();
	old_y_pos = 0;

	stats_text = nullptr;
}